

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O0

void value_destroy(value v)

{
  value_impl __ptr;
  value in_RDI;
  value_impl impl;
  
  __ptr = value_descriptor(in_RDI);
  if ((__ptr != (value_impl)0x0) && (__ptr->ref_count < 2)) {
    if (__ptr->finalizer != (value_finalizer_cb)0x0) {
      (*__ptr->finalizer)(in_RDI,__ptr->finalizer_data);
    }
    __ptr->magic = (uintptr_t)"value_impl_magic_free";
    free(__ptr);
  }
  return;
}

Assistant:

void value_destroy(value v)
{
	value_impl impl = value_descriptor(v);

	if (impl != NULL && impl->ref_count <= 1)
	{
		if (impl->finalizer != NULL)
		{
			impl->finalizer(v, impl->finalizer_data);
		}

		impl->magic = (uintptr_t)value_impl_magic_free;

		free(impl);
	}
}